

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

void mcmcliexp(mcmcxdef *cctx,mcmon clinum)

{
  mcmon *pmVar1;
  long lVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = CONCAT62(in_register_00000032,clinum) >> 8 & 0xffffff;
  if (cctx->mcmcxmtb[uVar3] == (mcmon *)0x0) {
    pmVar1 = (mcmon *)mchalo(cctx->mcmcxgl->mcmcxerr,0x200,"client mapping page");
    cctx->mcmcxmtb[uVar3] = pmVar1;
    for (lVar2 = 0; (int)lVar2 != 0x100; lVar2 = lVar2 + 1) {
      pmVar1[lVar2] = 0xffff;
    }
  }
  return;
}

Assistant:

static void mcmcliexp(mcmcxdef *cctx, mcmon clinum)
{
    /* add global number to client mapping table at client number */
    if (cctx->mcmcxmtb[clinum >> 8] == (mcmon *)0)
    {
        mcmcx1def *ctx = cctx->mcmcxgl;
        int        i;
        mcmon     *p;
        
        /* this page is not allocated - allocate it */
        p = (mcmon *)mchalo(ctx->mcmcxerr, (256 * sizeof(mcmon)),
                            "client mapping page");
        cctx->mcmcxmtb[clinum >> 8] = p;
        for (i = 0 ; i < 256 ; ++i) *p++ = MCMONINV;
    }
}